

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O3

bool check_barred(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  ushort uVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  CClass *pCVar8;
  OBJ_DATA *pOVar9;
  CHAR_DATA *pCVar10;
  CHAR_DATA *ch_00;
  MOB_INDEX_DATA *pMVar7;
  
  pMVar7 = (MOB_INDEX_DATA *)ch->in_room;
  ch_00 = (CHAR_DATA *)pMVar7->barred_entry;
  uVar4 = 0;
  if (ch_00 != (CHAR_DATA *)0x0) {
    do {
      bVar2 = is_npc(ch_00);
      pMVar7 = (MOB_INDEX_DATA *)(ulong)bVar2;
      if (bVar2) {
        pMVar7 = ch_00->pIndexData;
        pCVar10 = (CHAR_DATA *)pMVar7->barred_entry;
        if ((pCVar10 == (CHAR_DATA *)0x0) ||
           (uVar1 = *(ushort *)((long)&pCVar10->next + 6), pMVar7 = (MOB_INDEX_DATA *)(ulong)uVar1,
           uVar1 != to_room->vnum)) goto LAB_00253655;
        sVar3 = *(short *)&pCVar10->next;
        if (sVar3 == 0) {
          pCVar8 = ch->my_class;
          if ((pCVar8 == (CClass *)0x0) &&
             ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
              (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
            pCVar8 = CClass::GetClass(0);
          }
          uVar4 = CClass::GetIndex(pCVar8);
          pCVar10 = (CHAR_DATA *)ch_00->pIndexData->barred_entry;
          sVar3 = *(short *)&pCVar10->next;
        }
        switch(sVar3) {
        case 1:
          uVar4 = (uint)ch->cabal;
          break;
        case 2:
          uVar4 = (uint)ch->size;
          break;
        case 3:
          pOVar9 = get_eq_char(ch,0x13);
          pCVar10 = (CHAR_DATA *)ch_00->pIndexData->barred_entry;
          if ((pOVar9 != (OBJ_DATA *)0x0) || (*(short *)((long)&pCVar10->next + 4) == 0)) {
            uVar4 = (uint)pOVar9->pIndexData->vnum;
            sVar3 = *(short *)&pCVar10->next;
            goto switchD_00253557_default;
          }
          goto LAB_00253672;
        case 4:
          uVar4 = (uint)ch->level;
          break;
        default:
switchD_00253557_default:
          if (sVar3 == 0) {
            pCVar8 = ch->my_class;
            if ((pCVar8 == (CClass *)0x0) &&
               ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                (pCVar8 = ch->pIndexData->my_class, pCVar8 == (CClass *)0x0)))) {
              pCVar8 = CClass::GetClass(0);
            }
            iVar5 = CClass::GetIndex(pCVar8);
            pCVar10 = (CHAR_DATA *)ch_00->pIndexData->barred_entry;
            if ((((iVar5 == *(short *)((long)&pCVar10->next + 4)) &&
                 ((ch_00->act[0] & 0x2000000) != 0)) && (0 < ch->pause)) && (ch->ghost < 1)) {
              bVar2 = is_immortal(ch);
              if (!bVar2) {
                send_to_char("Your guild will not offer you sanctuary yet.\n\r",ch);
                uVar4 = 1;
                pMVar7 = (MOB_INDEX_DATA *)0x1;
                goto LAB_00253664;
              }
              pCVar10 = (CHAR_DATA *)ch_00->pIndexData->barred_entry;
            }
          }
        }
        uVar1 = *(ushort *)((long)&pCVar10->next + 2);
        pMVar7 = (MOB_INDEX_DATA *)(ulong)uVar1;
        if (uVar1 == 2) {
          uVar6 = (uint)*(short *)((long)&pCVar10->next + 4);
          pMVar7 = (MOB_INDEX_DATA *)(ulong)uVar6;
          if ((int)uVar4 <= (int)uVar6) goto LAB_00253672;
        }
        else if (uVar1 == 1) {
          uVar6 = (uint)*(short *)((long)&pCVar10->next + 4);
          pMVar7 = (MOB_INDEX_DATA *)(ulong)uVar6;
          if ((int)uVar6 <= (int)uVar4) goto LAB_00253672;
        }
        else if ((uVar1 == 0) &&
                (uVar6 = (uint)*(short *)((long)&pCVar10->next + 4),
                pMVar7 = (MOB_INDEX_DATA *)(ulong)uVar6, uVar4 != uVar6)) {
LAB_00253672:
          bVar2 = bar_entry(ch,ch_00,to_room);
          pMVar7 = (MOB_INDEX_DATA *)(ulong)bVar2;
          uVar4 = 1;
          goto LAB_00253664;
        }
      }
LAB_00253655:
      ch_00 = ch_00->next_in_room;
    } while (ch_00 != (CHAR_DATA *)0x0);
    uVar4 = 0;
  }
LAB_00253664:
  return (bool)((byte)uVar4 & (byte)pMVar7);
}

Assistant:

bool check_barred(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	int field = 0;

	for (auto blocker = ch->in_room->people; blocker != nullptr; blocker = blocker->next_in_room)
	{
		if (is_npc(blocker)
			&& blocker->pIndexData->barred_entry
			&& blocker->pIndexData->barred_entry->vnum == to_room->vnum)
		{

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS)
				field = ch->Class()->GetIndex();

			if (blocker->pIndexData->barred_entry->type == BAR_CABAL)
				field = ch->cabal;

			if (blocker->pIndexData->barred_entry->type == BAR_SIZE)
				field = ch->size;

			if (blocker->pIndexData->barred_entry->type == BAR_LEVEL)
				field = ch->level;

			if (blocker->pIndexData->barred_entry->type == BAR_TATTOO)
			{
				auto tattoo = get_eq_char(ch, WEAR_BRAND);

				if (!tattoo && blocker->pIndexData->barred_entry->value)
					return bar_entry(ch, blocker, to_room);

				field = tattoo->pIndexData->vnum;
			}

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS
				&& ch->Class()->GetIndex() == blocker->pIndexData->barred_entry->value
				&& IS_SET(blocker->act, ACT_GUILDGUARD)
				&& ch->pause > 0
				&& ch->ghost <= 0
				&& !is_immortal(ch))
			{
				send_to_char("Your guild will not offer you sanctuary yet.\n\r", ch);
				return true;
			}

			if ((blocker->pIndexData->barred_entry->comparison == BAR_EQUAL_TO && field != blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_LESS_THAN && field >= blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_GREATER_THAN && field <= blocker->pIndexData->barred_entry->value))
			{
				return bar_entry(ch, blocker, to_room);
			}
		}
	}

	return false;
}